

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O1

Gia_Man_t * Gia_ManRebuild(Gia_Man_t *p,Dsd_Manager_t *pManDsd,DdManager *ddNew)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Vec_Str_t *pVVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Dsd_Node_t *pDVar11;
  Gia_Obj_t *pGVar12;
  Dsd_Node_t **__ptr;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  int nNodesDsd;
  int local_54;
  Vec_Str_t *local_50;
  Vec_Str_t *local_48;
  Vec_Int_t *local_40;
  DdManager *local_38;
  
  local_38 = ddNew;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  local_40 = pVVar4;
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  pVVar6->nCap = 10000;
  pVVar6->nSize = 0;
  pcVar7 = (char *)malloc(10000);
  pVVar6->pArray = pcVar7;
  pVVar8 = (Vec_Str_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  pVVar8->pArray = pcVar7;
  local_48 = pVVar8;
  p_00 = Gia_ManStart(p->nObjs * 2);
  pcVar7 = p->pName;
  if (pcVar7 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar7);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar7);
  }
  p_00->pName = pcVar10;
  pcVar7 = p->pSpec;
  local_50 = pVVar6;
  if (pcVar7 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar7);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar7);
  }
  p_00->pSpec = pcVar10;
  Gia_ManHashAlloc(p_00);
  pDVar11 = Dsd_ManagerReadConst1(pManDsd);
  Dsd_NodeSetMark(pDVar11,1);
  if (0 < p->vCis->nSize) {
    iVar14 = 0;
    do {
      pDVar11 = Dsd_ManagerReadInput(pManDsd,iVar14);
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar1 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) goto LAB_0070ab10;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) goto LAB_0070ab10;
      Dsd_NodeSetMark(pDVar11,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * 0x55555556);
      iVar14 = iVar14 + 1;
    } while (iVar14 < p->vCis->nSize);
  }
  __ptr = Dsd_TreeCollectNodesDfs(pManDsd,&local_54);
  pVVar8 = local_48;
  pVVar6 = local_50;
  if (local_54 < 1) {
    bVar18 = true;
  }
  else {
    lVar17 = 0;
    do {
      iVar14 = Gia_ManRebuildNode(pManDsd,__ptr[lVar17],p_00,local_38,local_40,pVVar6,pVVar8);
      bVar18 = iVar14 == -1;
      if (bVar18) break;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_54);
  }
  if (__ptr != (Dsd_Node_t **)0x0) {
    free(__ptr);
  }
  pVVar4 = local_40;
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  if (pVVar6->pArray != (char *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (char *)0x0;
  }
  free(pVVar6);
  if (pVVar8->pArray != (char *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (char *)0x0;
  }
  free(pVVar8);
  if (bVar18) {
    Gia_ManStop(p_00);
    p_00 = Gia_ManDup(p);
  }
  else {
    if (0 < p->vCos->nSize) {
      iVar14 = 0;
      do {
        pDVar11 = Dsd_ManagerReadRoot(pManDsd,iVar14);
        uVar3 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar11 & 0xfffffffffffffffe));
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar16 = uVar3 >> 1;
        if (p_00->nObjs <= (int)uVar16) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(p_00->pObjs + uVar16) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p_00->pObjs + uVar16) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar12 = Gia_ManAppendObj(p_00);
        uVar1 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar1 | 0x80000000;
        pGVar2 = p_00->pObjs;
        if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) {
LAB_0070ab10:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar13 = (ulong)(((uint)((int)pGVar12 - (int)pGVar2) >> 2) * -0x55555555 - uVar16 &
                        0x1fffffff);
        uVar15 = (ulong)(((uVar3 ^ (uint)pDVar11) & 1) << 0x1d);
        *(ulong *)pGVar12 = uVar15 | uVar1 & 0xffffffffc0000000 | 0x80000000 | uVar13;
        *(ulong *)pGVar12 =
             uVar15 | uVar1 & 0xe0000000c0000000 | 0x80000000 | uVar13 |
             (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_00->pObjs;
        if ((pGVar12 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar12)) goto LAB_0070ab10;
        Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar12 - (long)pGVar2) >> 2) * -0x55555555);
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff),
                           pGVar12);
        }
        if ((pGVar12 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar12)) goto LAB_0070ab10;
        iVar14 = iVar14 + 1;
      } while (iVar14 < p->vCos->nSize);
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManRebuild( Gia_Man_t * p, Dsd_Manager_t * pManDsd, DdManager * ddNew )
{
    Gia_Man_t * pNew;
    Dsd_Node_t ** ppNodesDsd;
    Dsd_Node_t * pNodeDsd;
    int i, nNodesDsd, iLit = -1;
    Vec_Str_t * vSop, * vCube;
    Vec_Int_t * vFanins;

    vFanins = Vec_IntAlloc( 1000 );
    vSop    = Vec_StrAlloc( 10000 );
    vCube   = Vec_StrAlloc( 1000 );

    pNew = Gia_ManStart( 2*Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );

    // save the CI nodes in the DSD nodes
    Dsd_NodeSetMark( Dsd_ManagerReadConst1(pManDsd), 1 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadInput( pManDsd, i );
        Dsd_NodeSetMark( pNodeDsd, Gia_ManAppendCi( pNew ) );
    }

    // collect DSD nodes in DFS order (leaves and const1 are not collected)
    ppNodesDsd = Dsd_TreeCollectNodesDfs( pManDsd, &nNodesDsd );
    for ( i = 0; i < nNodesDsd; i++ )
    {
        iLit = Gia_ManRebuildNode( pManDsd, ppNodesDsd[i], pNew, ddNew, vFanins, vSop, vCube );
        if ( iLit == -1 )
            break;
    }
    ABC_FREE( ppNodesDsd );
    Vec_IntFree( vFanins );
    Vec_StrFree( vSop );
    Vec_StrFree( vCube );
    if ( iLit == -1 )
    {
        Gia_ManStop( pNew );
        return Gia_ManDup(p);
    }

    // set the pointers to the CO drivers
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        pNodeDsd = Dsd_ManagerReadRoot( pManDsd, i );
        iLit = Dsd_NodeReadMark( Dsd_Regular(pNodeDsd) );
        iLit = Abc_LitNotCond( iLit, Dsd_IsComplement(pNodeDsd) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}